

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

double log2(double __x)

{
  uint in_EDI;
  uint32_t res;
  uint local_4;
  
  local_4 = in_EDI;
  if (in_EDI != 0) {
    for (; 1 < local_4; local_4 = local_4 >> 1) {
    }
    return __x;
  }
  fprintf(_stderr,"log2 0, invalid!\n");
  exit(-1);
}

Assistant:

uint32_t log2(uint32_t val) {
    if (val == 0) {
        fprintf(stderr, "log2 0, invalid!\n");
        exit(-1);
    }
    uint32_t res = 0;
    while (val > 1) {
        val >>= 1;
        res++;
    }
    return res;
}